

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O2

void av1_pick_recursive_tx_size_type_yrd
               (AV1_COMP *cpi,MACROBLOCK *x,RD_STATS *rd_stats,BLOCK_SIZE bsize,int64_t ref_best_rd)

{
  MACROBLOCKD *xd;
  uint8_t *__src;
  char cVar1;
  BLOCK_SIZE plane_bsize;
  TX_SIZE_SEARCH_METHOD TVar2;
  byte bVar3;
  byte tx_size;
  int iVar4;
  MB_MODE_INFO *pMVar5;
  double dVar6;
  double dVar7;
  int64_t iVar8;
  int64_t iVar9;
  undefined7 uVar10;
  bool bVar11;
  uint8_t uVar12;
  int iVar13;
  int iVar14;
  uint32_t hash;
  int32_t iVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  _func_int64_t_uint8_t_ptr_int_uint8_t_ptr_int_int_int **pp_Var22;
  int64_t iVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  undefined8 uVar27;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  byte bVar28;
  long lVar29;
  long lVar30;
  int idx;
  int block;
  long lVar31;
  int iVar32;
  MB_RD_RECORD *mb_rd_record;
  undefined4 uVar33;
  undefined4 uVar34;
  double sse_norm;
  FAST_TX_SEARCH_MODE in_stack_fffffffffffffdb8;
  int local_224;
  long local_208;
  long local_1d8;
  long local_1d0;
  uint local_190;
  double rate_f;
  long local_178;
  int64_t iStack_170;
  long local_168;
  uint8_t local_160;
  SPEED_FEATURES *local_158;
  int64_t *local_150;
  macroblockd_plane *local_148;
  int64_t dist;
  int is_cost_valid;
  undefined4 uStack_134;
  TXFM_CONTEXT tx_above_1 [32];
  int bw;
  TXFM_CONTEXT tx_left [32];
  TXFM_CONTEXT tx_above [32];
  ENTROPY_CONTEXT ctxl [32];
  ENTROPY_CONTEXT ctxa [32];
  TXFM_CONTEXT tx_left_1 [32];
  
  xd = &x->e_mbd;
  rd_stats->rate = 0x7fffffff;
  rd_stats->zero_rate = 0;
  rd_stats->dist = 0x7fffffffffffffff;
  rd_stats->rdcost = 0x7fffffffffffffff;
  rd_stats->sse = 0x7fffffffffffffff;
  rd_stats->skip_txfm = '\0';
  lVar29 = (long)(cpi->sf).tx_sf.model_based_prune_tx_search_level;
  if (ref_best_rd != 0x7fffffffffffffff && lVar29 != 0) {
    cVar1 = (*(x->e_mbd).mi)->ref_frame[0];
    bVar11 = true;
    lVar25 = 0;
    lVar26 = 0;
    lVar30 = 0;
    while (bVar11) {
      plane_bsize = av1_ss_size_lookup[bsize][(x->e_mbd).plane[lVar25].subsampling_x]
                    [(x->e_mbd).plane[lVar25].subsampling_y];
      get_txb_dimensions(xd,0,plane_bsize,0,0,plane_bsize,(int *)0x0,(int *)0x0,&bw,
                         (int *)tx_above_1);
      iVar14 = bw;
      uVar33 = tx_above_1._0_4_;
      pp_Var22 = &aom_highbd_sse;
      if ((((x->e_mbd).cur_buf)->flags & 8) == 0) {
        pp_Var22 = &aom_sse;
      }
      iVar13 = (x->e_mbd).bd;
      iVar23 = (**pp_Var22)(x->plane[lVar25].src.buf,x->plane[lVar25].src.stride,
                            (x->e_mbd).plane[lVar25].dst.buf,(x->e_mbd).plane[lVar25].dst.stride,bw,
                            tx_above_1._0_4_);
      bVar28 = (char)iVar13 * '\x02' - 0x10;
      lVar31 = (long)((ulong)((uint)(1 << (bVar28 & 0x1f)) >> 1) + iVar23) >> (bVar28 & 0x3f);
      bVar28 = 3;
      if ((((x->e_mbd).cur_buf)->flags & 8) != 0) {
        bVar28 = (char)(x->e_mbd).bd - 5;
      }
      if (lVar31 == 0) {
        lVar25 = 0;
LAB_002202fa:
        lVar24 = 0;
      }
      else {
        iVar13 = (int)x->plane[lVar25].dequant_QTX[1] >> (bVar28 & 0x1f);
        if (iVar13 < 2) {
          iVar13 = 1;
        }
        dVar6 = (double)(uVar33 * iVar14);
        sse_norm = (double)lVar31 / dVar6;
        dVar7 = log2(sse_norm / ((double)iVar13 * (double)iVar13));
        av1_model_rd_curvfit(plane_bsize,sse_norm,dVar7,&rate_f,(double *)&is_cost_valid);
        dVar7 = (double)CONCAT44(rate_f._4_4_,rate_f._0_4_) * dVar6;
        uVar33 = 0;
        uVar34 = 0;
        if (0.0 <= dVar7) {
          uVar33 = SUB84(dVar7,0);
          uVar34 = (undefined4)((ulong)dVar7 >> 0x20);
        }
        iVar14 = (int)((double)CONCAT44(uVar34,uVar33) + 0.5);
        if (iVar14 == 0) {
          lVar25 = lVar31 << 4;
          goto LAB_002202fa;
        }
        dVar6 = sse_norm * (double)CONCAT44(uStack_134,is_cost_valid) * dVar6;
        dVar7 = 0.0;
        if (0.0 <= dVar6) {
          dVar7 = dVar6;
        }
        lVar25 = (long)(dVar7 + 0.5);
        lVar24 = (long)iVar14;
        if (lVar31 * 0x800 <= lVar25 * 0x80 + (x->rdmult * lVar24 + 0x100 >> 9)) {
          lVar24 = 0;
          lVar25 = lVar31 << 4;
        }
      }
      if (0xfffffffe < lVar31) {
        lVar31 = 0xffffffff;
      }
      x->pred_sse[cVar1] = (uint)lVar31;
      lVar30 = lVar30 + lVar24;
      lVar26 = lVar26 + lVar25;
      bVar11 = false;
      lVar25 = 1;
    }
    if ((lVar30 != 0) &&
       (ref_best_rd <
        (long)*(int *)((long)&DAT_0046dd98 + lVar29 * 4 + 4) *
        (lVar26 * 0x80 + ((long)x->rdmult * (long)(int)lVar30 + 0x100 >> 9)) >> 3)) {
      return;
    }
  }
  iVar14 = (x->e_mbd).mi_row;
  if ((((iVar14 < (x->e_mbd).tile.mi_row_start) ||
       ((x->e_mbd).tile.mi_row_end <=
        (int)(iVar14 + (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                             [bsize]))) ||
      (iVar14 = (x->e_mbd).mi_col, iVar14 < (x->e_mbd).tile.mi_col_start)) ||
     ((x->e_mbd).tile.mi_col_end <=
      (int)(iVar14 + (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                           [bsize]))) {
    local_224 = 1 << ("\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[bsize] - 4 & 0x1f
                     );
LAB_002204ea:
    bVar11 = false;
    mb_rd_record = (MB_RD_RECORD *)0x0;
    hash = 0;
  }
  else {
    local_224 = 1 << ("\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[bsize] - 4 & 0x1f
                     );
    if ((cpi->sf).rd_sf.use_mb_rd_hash == 0) goto LAB_002204ea;
    hash = get_block_residue_hash(x,bsize);
    mb_rd_record = (x->txfm_search_info).mb_rd_record;
    iVar15 = find_mb_rd_info(mb_rd_record,ref_best_rd,hash);
    if (iVar15 != -1) {
      pMVar5 = *(x->e_mbd).mi;
      __src = mb_rd_record->mb_rd_info[iVar15].blk_skip;
      pMVar5->tx_size = ((MB_RD_INFO *)(__src + -0x11))->tx_size;
      memcpy((x->txfm_search_info).blk_skip,__src,(long)local_224);
      uVar27 = *(undefined8 *)(__src + -8);
      *(undefined8 *)pMVar5->inter_tx_size = *(undefined8 *)(__src + -0x10);
      *(undefined8 *)(pMVar5->inter_tx_size + 8) = uVar27;
      memcpy((x->e_mbd).tx_type_map,mb_rd_record->mb_rd_info[iVar15].tx_type_map,(long)local_224);
      iVar14 = mb_rd_record->mb_rd_info[iVar15].rd_stats.zero_rate;
      iVar23 = mb_rd_record->mb_rd_info[iVar15].rd_stats.dist;
      iVar8 = mb_rd_record->mb_rd_info[iVar15].rd_stats.rdcost;
      iVar9 = mb_rd_record->mb_rd_info[iVar15].rd_stats.sse;
      rd_stats->rate = mb_rd_record->mb_rd_info[iVar15].rd_stats.rate;
      rd_stats->zero_rate = iVar14;
      rd_stats->dist = iVar23;
      rd_stats->rdcost = iVar8;
      rd_stats->sse = iVar9;
      uVar10 = *(undefined7 *)&mb_rd_record->mb_rd_info[iVar15].rd_stats.field_0x21;
      rd_stats->skip_txfm = mb_rd_record->mb_rd_info[iVar15].rd_stats.skip_txfm;
      *(undefined7 *)&rd_stats->field_0x21 = uVar10;
      return;
    }
    bVar11 = true;
  }
  if (((x->txfm_search_params).skip_txfm_level != 0) &&
     (iVar14 = predict_skip_txfm(x,bsize,&dist,(uint)(cpi->common).features.reduced_tx_set_used),
     iVar14 != 0)) {
    set_skip_txfm(x,rd_stats,bsize,dist);
joined_r0x00220cf6:
    if (!bVar11) {
      return;
    }
    save_mb_rd_info(local_224,hash,x,rd_stats,mb_rd_record);
    return;
  }
  if (ref_best_rd != 0) {
    TVar2 = (x->txfm_search_params).tx_size_search_method;
    local_1d8 = ref_best_rd;
    if (-ref_best_rd != -0x7fffffffffffffff && TVar2 != '\0') {
      lVar29 = 0;
      if (ref_best_rd >> 3 < -ref_best_rd + 0x7fffffffffffffff) {
        lVar29 = ref_best_rd >> 3;
      }
      local_1d8 = lVar29 + ref_best_rd;
    }
    local_148 = (x->e_mbd).plane;
    bVar28 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[bsize];
    bVar3 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[bsize];
    av1_get_entropy_contexts(bsize,local_148,ctxa,ctxl);
    memcpy(tx_above,(x->e_mbd).above_txfm_context,(ulong)bVar28);
    memcpy(tx_left,(x->e_mbd).left_txfm_context,(ulong)bVar3);
    local_158 = &cpi->sf;
    iVar16 = get_search_init_depth
                       ((uint)bVar28,(uint)bVar3,1,local_158,
                        (uint)(x->txfm_search_params).tx_size_search_method);
    tx_size = ""[bsize];
    iVar14 = *(int *)((long)tx_size_high_unit + (ulong)((uint)tx_size * 4));
    iVar13 = *(int *)((long)tx_size_wide_unit + (ulong)((uint)tx_size * 4));
    uVar17 = av1_get_skip_txfm_context(xd);
    iVar4 = (x->mode_costs).skip_txfm_cost[uVar17][0];
    lVar26 = (long)(x->mode_costs).skip_txfm_cost[uVar17][1];
    iVar21 = x->rdmult;
    uVar27 = 0x100;
    lVar25 = iVar21 * lVar26 + 0x100 >> 9;
    rd_stats->rate = 0;
    rd_stats->dist = 0;
    rd_stats->rdcost = 0;
    rd_stats->sse = 0;
    rd_stats->skip_txfm = '\x01';
    rd_stats->zero_rate = 0;
    lVar29 = (long)iVar21 * (long)iVar4 + 0x100 >> 9;
    local_1d0 = 0;
    local_208 = 0;
    iVar21 = 0;
    iVar32 = 0;
    local_150 = &rd_stats->dist;
    for (iVar20 = 0; iVar18 = max_block_high(xd,bsize,(int)uVar27), iVar20 < iVar18;
        iVar20 = iVar20 + iVar14) {
      uVar27 = extraout_RDX;
      for (iVar18 = 0; iVar19 = max_block_wide(xd,bsize,(int)uVar27), iVar18 < iVar19;
          iVar18 = iVar18 + iVar13) {
        if (lVar25 < lVar29) {
          lVar29 = lVar25;
        }
        iVar23 = local_1d8 - lVar29;
        if (local_1d8 == 0x7fffffffffffffff) {
          iVar23 = 0x7fffffffffffffff;
        }
        is_cost_valid = 1;
        select_tx_block(cpi,x,iVar20,iVar18,iVar32,tx_size,iVar16,bsize,ctxa,ctxl,tx_above,tx_left,
                        (RD_STATS *)&rate_f,0x7fffffffffffffff,iVar23,&is_cost_valid,TVar2 != '\0');
        if ((is_cost_valid == 0) || (rate_f._0_4_ == 0x7fffffff)) goto LAB_00220bc0;
        av1_merge_rd_stats(rd_stats,(RD_STATS *)&rate_f);
        iVar21 = rd_stats->rate;
        local_208 = rd_stats->sse;
        lVar25 = local_208 * 0x80 + (x->rdmult * lVar26 + 0x100 >> 9);
        local_1d0 = rd_stats->dist;
        lVar29 = local_1d0 * 0x80 + ((long)(iVar4 + iVar21) * (long)x->rdmult + 0x100 >> 9);
        iVar32 = iVar32 + iVar13 * iVar14;
        uVar27 = extraout_RDX_01;
      }
      uVar27 = extraout_RDX_00;
    }
    if (iVar21 != 0x7fffffff) {
      uVar12 = lVar25 <= lVar29;
      rd_stats->skip_txfm = lVar25 <= lVar29;
      if ((TVar2 != '\0') && ((cpi->sf).tx_sf.refine_fast_tx_search_results != 0)) {
        if (ref_best_rd < 0) {
          rd_stats->rate = 0x7fffffff;
          rd_stats->dist = 0x7fffffffffffffff;
          rd_stats->rdcost = 0x7fffffffffffffff;
          rd_stats->sse = 0x7fffffffffffffff;
          goto LAB_00220beb;
        }
        rd_stats->rate = 0;
        *local_150 = 0;
        local_150[1] = 0;
        local_150[2] = 0;
        rd_stats->skip_txfm = '\x01';
        rd_stats->zero_rate = 0;
        uVar17 = (uint)tx_size;
        if ((x->e_mbd).lossless[*(ushort *)&(*(x->e_mbd).mi)->field_0xa7 & 7] != 0) {
          uVar17 = 0;
        }
        iVar14 = *(int *)((long)tx_size_high_unit + (ulong)(uVar17 << 2));
        iVar13 = *(int *)((long)tx_size_wide_unit + (ulong)(uVar17 << 2));
        iVar21 = get_search_init_depth
                           ((uint)bVar28,(uint)bVar3,1,local_158,
                            (uint)(x->txfm_search_params).tx_size_search_method);
        av1_get_entropy_contexts
                  (bsize,local_148,(ENTROPY_CONTEXT *)&is_cost_valid,(ENTROPY_CONTEXT *)&bw);
        memcpy(tx_above_1,(x->e_mbd).above_txfm_context,(ulong)bVar28);
        memcpy(tx_left_1,(x->e_mbd).left_txfm_context,(ulong)bVar3);
        iVar16 = 0;
        lVar29 = 0;
        for (iVar20 = 0; iVar20 < (int)(uint)bVar3; iVar20 = iVar20 + iVar14) {
          for (iVar32 = 0; local_190 = (uint)bVar28, iVar32 < (int)local_190;
              iVar32 = iVar32 + iVar13) {
            rate_f._0_4_ = 0;
            local_178 = 0;
            iStack_170 = 0;
            local_168 = 0;
            local_160 = '\x01';
            rate_f._4_4_ = 0;
            tx_block_yrd(cpi,x,iVar20,iVar32,iVar16,(TX_SIZE)uVar17,bsize,iVar21,
                         (ENTROPY_CONTEXT *)&is_cost_valid,(ENTROPY_CONTEXT *)&bw,tx_above_1,
                         tx_left_1,ref_best_rd - lVar29,(RD_STATS *)&rate_f,
                         in_stack_fffffffffffffdb8);
            lVar25 = (long)rate_f._0_4_;
            if (lVar25 == 0x7fffffff) goto LAB_00220bc0;
            av1_merge_rd_stats(rd_stats,(RD_STATS *)&rate_f);
            lVar30 = local_178 * 0x80 + (lVar25 * x->rdmult + 0x100 >> 9);
            lVar25 = local_168 * 0x80 + ((long)rate_f._4_4_ * (long)x->rdmult + 0x100 >> 9);
            if (lVar30 < lVar25) {
              lVar25 = lVar30;
            }
            lVar29 = lVar29 + lVar25;
            iVar16 = iVar16 + iVar13 * iVar14;
          }
        }
        uVar17 = av1_get_skip_txfm_context(xd);
        local_208 = rd_stats->sse;
        lVar25 = local_208 * 0x80 +
                 ((long)(x->mode_costs).skip_txfm_cost[uVar17][1] * (long)x->rdmult + 0x100 >> 9);
        iVar21 = rd_stats->rate;
        lVar29 = rd_stats->dist * 0x80 +
                 (((long)(x->mode_costs).skip_txfm_cost[uVar17][0] + (long)iVar21) * (long)x->rdmult
                  + 0x100 >> 9);
        local_1d0 = rd_stats->dist;
        if (lVar25 < lVar29) {
          rd_stats->rate = 0;
          rd_stats->dist = local_208;
          rd_stats->skip_txfm = '\x01';
          iVar21 = 0;
          lVar29 = lVar25;
          local_1d0 = local_208;
        }
        if (lVar29 <= ref_best_rd) {
          rd_stats->rate = 0x7fffffff;
          rd_stats->zero_rate = 0;
          rd_stats->dist = 0x7fffffffffffffff;
          rd_stats->rdcost = 0x7fffffffffffffff;
          rd_stats->sse = 0x7fffffffffffffff;
          rd_stats->skip_txfm = '\0';
          goto LAB_00220beb;
        }
        uVar12 = rd_stats->skip_txfm;
      }
      if (uVar12 == '\0') {
        lVar29 = local_1d0 * 0x80 + ((long)(iVar21 + iVar4) * (long)x->rdmult + 0x100 >> 9);
        if (((x->e_mbd).lossless[*(ushort *)&(*(x->e_mbd).mi)->field_0xa7 & 7] == 0) &&
           (lVar26 = local_208 * 0x80 + (x->rdmult * lVar26 + 0x100 >> 9), lVar26 <= lVar29)) {
          lVar29 = lVar26;
        }
      }
      else {
        lVar29 = local_208 * 0x80 + (x->rdmult * lVar26 + 0x100 >> 9);
      }
      if (lVar29 != 0x7fffffffffffffff) goto joined_r0x00220cf6;
    }
  }
LAB_00220beb:
  rd_stats->rate = 0x7fffffff;
  rd_stats->zero_rate = 0;
  rd_stats->dist = 0x7fffffffffffffff;
  rd_stats->rdcost = 0x7fffffffffffffff;
  rd_stats->sse = 0x7fffffffffffffff;
  rd_stats->skip_txfm = '\0';
  return;
LAB_00220bc0:
  rd_stats->rate = 0x7fffffff;
  rd_stats->zero_rate = 0;
  rd_stats->dist = 0x7fffffffffffffff;
  rd_stats->rdcost = 0x7fffffffffffffff;
  rd_stats->sse = 0x7fffffffffffffff;
  rd_stats->skip_txfm = '\0';
  goto LAB_00220beb;
}

Assistant:

void av1_pick_recursive_tx_size_type_yrd(const AV1_COMP *cpi, MACROBLOCK *x,
                                         RD_STATS *rd_stats, BLOCK_SIZE bsize,
                                         int64_t ref_best_rd) {
  MACROBLOCKD *const xd = &x->e_mbd;
  const TxfmSearchParams *txfm_params = &x->txfm_search_params;
  assert(is_inter_block(xd->mi[0]));

  av1_invalid_rd_stats(rd_stats);

  // If modeled RD cost is a lot worse than the best so far, terminate early.
  if (cpi->sf.tx_sf.model_based_prune_tx_search_level &&
      ref_best_rd != INT64_MAX) {
    if (model_based_tx_search_prune(cpi, x, bsize, ref_best_rd)) return;
  }

  // Hashing based speed feature. If the hash of the prediction residue block is
  // found in the hash table, use previous search results and terminate early.
  uint32_t hash = 0;
  MB_RD_RECORD *mb_rd_record = NULL;
  const int mi_row = x->e_mbd.mi_row;
  const int mi_col = x->e_mbd.mi_col;
  const int within_border =
      mi_row >= xd->tile.mi_row_start &&
      (mi_row + mi_size_high[bsize] < xd->tile.mi_row_end) &&
      mi_col >= xd->tile.mi_col_start &&
      (mi_col + mi_size_wide[bsize] < xd->tile.mi_col_end);
  const int is_mb_rd_hash_enabled =
      (within_border && cpi->sf.rd_sf.use_mb_rd_hash);
  const int n4 = bsize_to_num_blk(bsize);
  if (is_mb_rd_hash_enabled) {
    hash = get_block_residue_hash(x, bsize);
    mb_rd_record = x->txfm_search_info.mb_rd_record;
    const int match_index = find_mb_rd_info(mb_rd_record, ref_best_rd, hash);
    if (match_index != -1) {
      MB_RD_INFO *mb_rd_info = &mb_rd_record->mb_rd_info[match_index];
      fetch_mb_rd_info(n4, mb_rd_info, rd_stats, x);
      return;
    }
  }

  // If we predict that skip is the optimal RD decision - set the respective
  // context and terminate early.
  int64_t dist;
  if (txfm_params->skip_txfm_level &&
      predict_skip_txfm(x, bsize, &dist,
                        cpi->common.features.reduced_tx_set_used)) {
    set_skip_txfm(x, rd_stats, bsize, dist);
    // Save the RD search results into mb_rd_record.
    if (is_mb_rd_hash_enabled)
      save_mb_rd_info(n4, hash, x, rd_stats, mb_rd_record);
    return;
  }
#if CONFIG_SPEED_STATS
  ++x->txfm_search_info.tx_search_count;
#endif  // CONFIG_SPEED_STATS

  const int64_t rd =
      select_tx_size_and_type(cpi, x, rd_stats, bsize, ref_best_rd);

  if (rd == INT64_MAX) {
    // We should always find at least one candidate unless ref_best_rd is less
    // than INT64_MAX (in which case, all the calls to select_tx_size_fix_type
    // might have failed to find something better)
    assert(ref_best_rd != INT64_MAX);
    av1_invalid_rd_stats(rd_stats);
    return;
  }

  // Save the RD search results into mb_rd_record.
  if (is_mb_rd_hash_enabled) {
    assert(mb_rd_record != NULL);
    save_mb_rd_info(n4, hash, x, rd_stats, mb_rd_record);
  }
}